

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O2

uint __thiscall agg::gsv_text::vertex(gsv_text *this,double *x,double *y)

{
  int8 iVar1;
  char cVar2;
  int8 *piVar3;
  int8u *piVar4;
  int8u *piVar5;
  int8u *piVar6;
  ulong uVar7;
  byte *pbVar8;
  status sVar9;
  status sVar10;
  int8u *piVar11;
  int8u *piVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  
  if ((this->m_flip & 1U) == 0) {
    dVar16 = this->m_height + this->m_line_space;
  }
  else {
    dVar16 = -this->m_height - this->m_line_space;
  }
  piVar3 = this->m_bglyph;
  sVar9 = this->m_status;
  dVar14 = this->m_y;
  pbVar8 = (byte *)this->m_cur_chr;
  dVar17 = this->m_x;
LAB_001123be:
  bVar13 = false;
  sVar10 = sVar9;
LAB_001123c3:
  if (bVar13) {
    return 0;
  }
code_r0x001123d5:
  sVar9 = next_char;
  switch(sVar10) {
  case initial:
    break;
  case next_char:
    goto switchD_001123dc_caseD_1;
  case start_glyph:
    goto switchD_001123dc_caseD_2;
  case glyph:
    if (piVar3 < this->m_eglyph) {
      this->m_bglyph = piVar3 + 1;
      iVar1 = *piVar3;
      this->m_bglyph = piVar3 + 2;
      cVar2 = piVar3[1];
      auVar15 = ZEXT216(CONCAT11((char)(cVar2 * '\x02') >> 1,iVar1));
      auVar15 = pmovsxbd(auVar15,auVar15);
      dVar17 = this->m_w * (double)auVar15._0_4_ + dVar17;
      this->m_x = dVar17;
      this->m_y = this->m_h * (double)auVar15._4_4_ + dVar14;
      *x = dVar17;
      *y = this->m_y;
      return (-1 < cVar2) + 1;
    }
    this->m_status = next_char;
    this->m_x = this->m_space + dVar17;
    dVar17 = dVar17 + this->m_space;
    goto LAB_001123be;
  default:
    goto code_r0x001123d5;
  }
  bVar13 = true;
  sVar10 = initial;
  if (this->m_font == (void *)0x0) goto LAB_001123c3;
  this->m_status = next_char;
switchD_001123dc_caseD_1:
  bVar13 = true;
  sVar10 = sVar9;
  if (*pbVar8 != 0) goto code_r0x001123fb;
  goto LAB_001123c3;
code_r0x001123fb:
  this->m_cur_chr = (char *)(pbVar8 + 1);
  uVar7 = (ulong)*pbVar8;
  if (uVar7 != 10) {
    piVar4 = this->m_indices;
    bVar13 = this->m_big_endian != false;
    piVar11 = piVar4 + uVar7 * 2;
    piVar5 = piVar4 + uVar7 * 2 + 1;
    if (bVar13) {
      piVar11 = piVar4 + uVar7 * 2 + 1;
      piVar5 = piVar4 + uVar7 * 2;
    }
    piVar12 = piVar4 + uVar7 * 2 + 2;
    piVar6 = piVar4 + uVar7 * 2 + 3;
    if (bVar13) {
      piVar12 = piVar4 + uVar7 * 2 + 3;
      piVar6 = piVar4 + uVar7 * 2 + 2;
    }
    this->m_bglyph = this->m_glyphs + CONCAT11(*piVar5,*piVar11);
    this->m_eglyph = this->m_glyphs + CONCAT11(*piVar6,*piVar12);
switchD_001123dc_caseD_2:
    *x = dVar17;
    *y = this->m_y;
    this->m_status = glyph;
    return 1;
  }
  this->m_x = this->m_start_x;
  dVar14 = dVar14 - dVar16;
  this->m_y = dVar14;
  pbVar8 = pbVar8 + 1;
  dVar17 = this->m_start_x;
  goto LAB_001123be;
}

Assistant:

unsigned gsv_text::vertex(double* x, double* y)
    {
        unsigned idx;
        int8 yc, yf;
        int dx, dy;
        bool quit = false;
        
        while(!quit)
        {
            switch(m_status)
            {
            case initial:
                if(m_font == 0) 
                {
                    quit = true;
                    break;
                }
                m_status = next_char;

            case next_char:
                if(*m_cur_chr == 0) 
                {
                    quit = true;
                    break;
                }
                idx = (*m_cur_chr++) & 0xFF;
                if(idx == '\n')
                {
                    m_x = m_start_x;
                    m_y -= m_flip ? -m_height - m_line_space : m_height + m_line_space;
                    break;
                }
                idx <<= 1;
                m_bglyph = m_glyphs + value(m_indices + idx);
                m_eglyph = m_glyphs + value(m_indices + idx + 2);
                m_status = start_glyph;

            case start_glyph:
                *x = m_x;
                *y = m_y;
                m_status = glyph;
                return path_cmd_move_to;

            case glyph:
                if(m_bglyph >= m_eglyph)
                {
                    m_status = next_char;
                    m_x += m_space;
                    break;
                }
                dx = int(*m_bglyph++);
                yf = (yc = *m_bglyph++) & 0x80;
                yc <<= 1; 
                yc >>= 1;
                dy = int(yc);
                m_x += double(dx) * m_w;
                m_y += double(dy) * m_h;
                *x = m_x;
                *y = m_y;
                return yf ? path_cmd_move_to : path_cmd_line_to;
            }

        }
        return path_cmd_stop;
    }